

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::MockGLEngine::initializeImGui(MockGLEngine *this)

{
  ImGuiIO *pIVar1;
  long in_RDI;
  int *unaff_retaddr;
  int tex_h;
  int tex_w;
  uchar *tex_pixels;
  ImGuiIO *io;
  Engine *in_stack_00000290;
  
  ImGui::CreateContext((ImFontAtlas *)tex_pixels);
  pIVar1 = ImGui::GetIO();
  ImFontAtlas::GetTexDataAsRGBA32
            ((ImFontAtlas *)this,(uchar **)io,(int *)tex_pixels,_tex_h,unaff_retaddr);
  Engine::setImGuiStyle(in_stack_00000290);
  *(ImFontAtlas **)(in_RDI + 0x250) = pIVar1->Fonts;
  return;
}

Assistant:

void MockGLEngine::initializeImGui() {

  ImGui::CreateContext(); // must call once at start

  // Set up ImGUI glfw bindings

  // Build a fake font atlas for mocking
  ImGuiIO& io = ImGui::GetIO();
  unsigned char* tex_pixels = NULL;
  int tex_w, tex_h;
  io.Fonts->GetTexDataAsRGBA32(&tex_pixels, &tex_w, &tex_h);

  // io.OptResizeWindowsFromEdges = true;
  // ImGui::StyleColorsLight();
  setImGuiStyle();

  globalFontAtlas = io.Fonts;
}